

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void DrawLevelBackground(Level *lev,double *pos)

{
  int iVar1;
  BoundingBox *in_RSI;
  QuadTreeNode *in_RDI;
  float framec;
  float h;
  float w;
  
  if (in_RDI != (QuadTreeNode *)0x0) {
    iVar1 = (screen_width * 0x1e0) / screen_height;
    framec = (float)iVar1;
    ::framec = ::framec + 1;
    DispBox.TL.Pos[0] = (in_RSI->TL).Pos[0] - (double)(framec / 2.0);
    DispBox.TL.Pos[1] = (in_RSI->TL).Pos[1] - 240.0;
    DispBox.BR.Pos[0] = DispBox.TL.Pos[0] + (double)iVar1;
    DispBox.BR.Pos[1] = DispBox.TL.Pos[1] + 480.0;
    BeginQuadTreeDraw(_h,in_RDI,in_RSI,(uint)framec);
  }
  return;
}

Assistant:

void DrawLevelBackground(struct Level *lev, double *pos)
{
   float w, h;
   if (!lev)
      return;
   h = 480.0;
   w = screen_width * 480 / screen_height;
   framec++;
   DispBox.TL.Pos[0] = pos[0] - w / 2;
   DispBox.TL.Pos[1] = pos[1] - h / 2;
   DispBox.BR.Pos[0] = DispBox.TL.Pos[0] + w;
   DispBox.BR.Pos[1] = DispBox.TL.Pos[1] + h;
   
   BeginQuadTreeDraw(lev, &lev->DisplayTree, &DispBox, framec);
}